

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O2

FT_Error af_latin_hints_init(AF_GlyphHints hints,AF_LatinMetrics metrics)

{
  FT_Render_Mode FVar1;
  FT_Face pFVar2;
  FT_Pos FVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  pFVar2 = (metrics->root).scaler.face;
  hints->metrics = &metrics->root;
  uVar4 = (metrics->root).scaler.flags;
  FVar3 = metrics->axis[0].delta;
  hints->x_scale = metrics->axis[0].scale;
  hints->x_delta = FVar3;
  FVar3 = metrics->axis[1].delta;
  hints->y_scale = metrics->axis[1].scale;
  hints->y_delta = FVar3;
  FVar1 = (metrics->root).scaler.render_mode;
  if (((FVar1 & ~FT_RENDER_MODE_MONO) == FT_RENDER_MODE_LIGHT) || ((pFVar2->style_flags & 1) != 0))
  {
    uVar4 = uVar4 | 1;
  }
  uVar6 = (uint)((FVar1 & ~FT_RENDER_MODE_LIGHT) == FT_RENDER_MODE_MONO);
  uVar5 = uVar6 + 2;
  if (FVar1 == FT_RENDER_MODE_LCD_V) {
    uVar6 = uVar5;
  }
  if (FVar1 == FT_RENDER_MODE_MONO) {
    uVar6 = uVar5;
  }
  uVar5 = uVar6 + 4;
  if ((FVar1 & ~FT_RENDER_MODE_MONO) == FT_RENDER_MODE_LIGHT) {
    uVar5 = uVar6;
  }
  uVar6 = uVar5 | 8;
  if (FVar1 != FT_RENDER_MODE_MONO) {
    uVar6 = uVar5;
  }
  hints->scaler_flags = uVar4;
  hints->other_flags = uVar6;
  return 0;
}

Assistant:

static FT_Error
  af_latin_hints_init( AF_GlyphHints    hints,
                       AF_LatinMetrics  metrics )
  {
    FT_Render_Mode  mode;
    FT_UInt32       scaler_flags, other_flags;
    FT_Face         face = metrics->root.scaler.face;


    af_glyph_hints_rescale( hints, (AF_StyleMetrics)metrics );

    /*
     * correct x_scale and y_scale if needed, since they may have
     * been modified by `af_latin_metrics_scale_dim' above
     */
    hints->x_scale = metrics->axis[AF_DIMENSION_HORZ].scale;
    hints->x_delta = metrics->axis[AF_DIMENSION_HORZ].delta;
    hints->y_scale = metrics->axis[AF_DIMENSION_VERT].scale;
    hints->y_delta = metrics->axis[AF_DIMENSION_VERT].delta;

    /* compute flags depending on render mode, etc. */
    mode = metrics->root.scaler.render_mode;

    scaler_flags = hints->scaler_flags;
    other_flags  = 0;

    /*
     * We snap the width of vertical stems for the monochrome and
     * horizontal LCD rendering targets only.
     */
    if ( mode == FT_RENDER_MODE_MONO || mode == FT_RENDER_MODE_LCD )
      other_flags |= AF_LATIN_HINTS_HORZ_SNAP;

    /*
     * We snap the width of horizontal stems for the monochrome and
     * vertical LCD rendering targets only.
     */
    if ( mode == FT_RENDER_MODE_MONO || mode == FT_RENDER_MODE_LCD_V )
      other_flags |= AF_LATIN_HINTS_VERT_SNAP;

    /*
     * We adjust stems to full pixels unless in `light' or `lcd' mode.
     */
    if ( mode != FT_RENDER_MODE_LIGHT && mode != FT_RENDER_MODE_LCD )
      other_flags |= AF_LATIN_HINTS_STEM_ADJUST;

    if ( mode == FT_RENDER_MODE_MONO )
      other_flags |= AF_LATIN_HINTS_MONO;

    /*
     * In `light' or `lcd' mode we disable horizontal hinting completely.
     * We also do it if the face is italic.
     *
     * However, if warping is enabled (which only works in `light' hinting
     * mode), advance widths get adjusted, too.
     */
    if ( mode == FT_RENDER_MODE_LIGHT || mode == FT_RENDER_MODE_LCD ||
         ( face->style_flags & FT_STYLE_FLAG_ITALIC ) != 0          )
      scaler_flags |= AF_SCALER_FLAG_NO_HORIZONTAL;

    hints->scaler_flags = scaler_flags;
    hints->other_flags  = other_flags;

    return FT_Err_Ok;
  }